

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O1

wchar_t archive_read_format_cab_cleanup(archive_read *a)

{
  void *__ptr;
  ulong uVar1;
  long lVar2;
  
  __ptr = a->format->data;
  if (*(long *)((long)__ptr + 0x60) != 0) {
    if (*(short *)((long)__ptr + 0x50) != 0) {
      lVar2 = 0x38;
      uVar1 = 0;
      do {
        free(*(void **)(*(long *)((long)__ptr + 0x60) + lVar2));
        uVar1 = uVar1 + 1;
        lVar2 = lVar2 + 0x60;
      } while (uVar1 < *(ushort *)((long)__ptr + 0x50));
    }
    free(*(void **)((long)__ptr + 0x60));
  }
  if (*(long *)((long)__ptr + 0x68) != 0) {
    if (*(short *)((long)__ptr + 0x52) != 0) {
      lVar2 = 0x18;
      uVar1 = 0;
      do {
        archive_string_free((archive_string *)(*(long *)((long)__ptr + 0x68) + lVar2));
        uVar1 = uVar1 + 1;
        lVar2 = lVar2 + 0x30;
      } while (uVar1 < *(ushort *)((long)__ptr + 0x52));
    }
    free(*(void **)((long)__ptr + 0x68));
  }
  if (*(char *)((long)__ptr + 0x180) != '\0') {
    inflateEnd((long)__ptr + 0x110);
  }
  if (*(long *)((long)__ptr + 0x1b8) != 0) {
    free(*(void **)(*(long *)((long)__ptr + 0x1b8) + 0x10));
    free(*(void **)(*(long *)((long)__ptr + 0x1b8) + 0x60));
    lVar2 = *(long *)((long)__ptr + 0x1b8);
    free(*(void **)(lVar2 + 0xc0));
    free(*(void **)(lVar2 + 0xd8));
    lVar2 = *(long *)((long)__ptr + 0x1b8);
    free(*(void **)(lVar2 + 0x1f8));
    free(*(void **)(lVar2 + 0x210));
    lVar2 = *(long *)((long)__ptr + 0x1b8);
    free(*(void **)(lVar2 + 400));
    free(*(void **)(lVar2 + 0x1a8));
    lVar2 = *(long *)((long)__ptr + 0x1b8);
    free(*(void **)(lVar2 + 0x128));
    free(*(void **)(lVar2 + 0x140));
    free(*(void **)((long)__ptr + 0x1b8));
    *(undefined8 *)((long)__ptr + 0x1b8) = 0;
  }
  archive_wstring_free((archive_wstring *)((long)__ptr + 0x78));
  free(*(void **)((long)__ptr + 0xa0));
  free(__ptr);
  a->format->data = (void *)0x0;
  return L'\0';
}

Assistant:

static int
archive_read_format_cab_cleanup(struct archive_read *a)
{
	struct cab *cab = (struct cab *)(a->format->data);
	struct cfheader *hd = &cab->cfheader;
	int i;

	if (hd->folder_array != NULL) {
		for (i = 0; i < hd->folder_count; i++)
			free(hd->folder_array[i].cfdata.memimage);
		free(hd->folder_array);
	}
	if (hd->file_array != NULL) {
		for (i = 0; i < cab->cfheader.file_count; i++)
			archive_string_free(&(hd->file_array[i].pathname));
		free(hd->file_array);
	}
#ifdef HAVE_ZLIB_H
	if (cab->stream_valid)
		inflateEnd(&cab->stream);
#endif
	lzx_decode_free(&cab->xstrm);
	archive_wstring_free(&cab->ws);
	free(cab->uncompressed_buffer);
	free(cab);
	(a->format->data) = NULL;
	return (ARCHIVE_OK);
}